

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O3

Try * __thiscall
wasm::Builder::makeTry
          (Builder *this,Name name,Expression *body,
          vector<wasm::Name,_std::allocator<wasm::Name>_> *catchTags,
          vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *catchBodies,
          Name delegateTarget,optional<wasm::Type> type)

{
  Try *pTVar1;
  MixedArena *this_00;
  
  this_00 = (MixedArena *)(this->wasm + 0x200);
  pTVar1 = (Try *)MixedArena::allocSpace(this_00,0x78,8);
  (pTVar1->super_SpecificExpression<(wasm::Expression::Id)52>).super_Expression._id = TryId;
  (pTVar1->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data = (Name *)0x0;
  (pTVar1->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements = 0;
  (pTVar1->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.allocatedElements =
       0;
  (pTVar1->super_SpecificExpression<(wasm::Expression::Id)52>).super_Expression.type.id = 0;
  (pTVar1->catchTags).allocator = this_00;
  (pTVar1->catchBodies).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  data = (Expression **)0x0;
  (pTVar1->catchBodies).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  usedElements = 0;
  (pTVar1->catchBodies).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  allocatedElements = 0;
  (pTVar1->catchBodies).allocator = this_00;
  (pTVar1->delegateTarget).super_IString.str._M_len = 0;
  (pTVar1->delegateTarget).super_IString.str._M_str = (char *)0x0;
  (pTVar1->name).super_IString.str._M_len = name.super_IString.str._M_len;
  (pTVar1->name).super_IString.str._M_str = name.super_IString.str._M_str;
  pTVar1->body = body;
  ArenaVectorBase<ArenaVector<wasm::Name>,wasm::Name>::
  set<std::vector<wasm::Name,std::allocator<wasm::Name>>>
            ((ArenaVectorBase<ArenaVector<wasm::Name>,wasm::Name> *)&pTVar1->catchTags,catchTags);
  ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
  set<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
            ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)
             &pTVar1->catchBodies,catchBodies);
  wasm::Try::finalize(pTVar1,type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                             super__Optional_payload_base<wasm::Type>._M_payload,
                      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                      super__Optional_payload_base<wasm::Type>._8_4_);
  return pTVar1;
}

Assistant:

Try* makeTry(Name name,
               Expression* body,
               const std::vector<Name>& catchTags,
               const std::vector<Expression*>& catchBodies,
               Name delegateTarget,
               std::optional<Type> type = std::nullopt) {
    auto* ret = wasm.allocator.alloc<Try>();
    ret->name = name;
    ret->body = body;
    ret->catchTags.set(catchTags);
    ret->catchBodies.set(catchBodies);
    ret->finalize(type);
    return ret;
  }